

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucptrie.cpp
# Opt level: O0

uint32_t ucptrie_get_63(UCPTrie *trie,UChar32 c)

{
  uint uVar1;
  uint32_t uVar2;
  int local_34;
  int local_30;
  int local_2c;
  int local_18;
  UChar32 fastMax;
  int32_t dataIndex;
  UChar32 c_local;
  UCPTrie *trie_local;
  
  local_18 = c;
  if (0x7f < (uint)c) {
    uVar1 = 0xfff;
    if (trie->type == '\0') {
      uVar1 = 0xffff;
    }
    if (uVar1 < (uint)c) {
      if ((uint)c < 0x110000) {
        if (c < trie->highStart) {
          local_30 = ucptrie_internalSmallIndex_63(trie,c);
        }
        else {
          local_30 = trie->dataLength + -2;
        }
        local_34 = local_30;
      }
      else {
        local_34 = trie->dataLength + -1;
      }
      local_2c = local_34;
    }
    else {
      local_2c = (uint)trie->index[c >> 6] + (c & 0x3fU);
    }
    local_18 = local_2c;
  }
  uVar2 = anon_unknown.dwarf_ddac6::getValue(trie->data,(int)trie->valueWidth,local_18);
  return uVar2;
}

Assistant:

U_CAPI uint32_t U_EXPORT2
ucptrie_get(const UCPTrie *trie, UChar32 c) {
    int32_t dataIndex;
    if ((uint32_t)c <= 0x7f) {
        // linear ASCII
        dataIndex = c;
    } else {
        UChar32 fastMax = trie->type == UCPTRIE_TYPE_FAST ? 0xffff : UCPTRIE_SMALL_MAX;
        dataIndex = _UCPTRIE_CP_INDEX(trie, fastMax, c);
    }
    return getValue(trie->data, (UCPTrieValueWidth)trie->valueWidth, dataIndex);
}